

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O2

Status __thiscall
leveldb::SetCurrentFile(leveldb *this,Env *env,string *dbname,uint64_t descriptor_number)

{
  pointer pcVar1;
  bool bVar2;
  long in_FS_OFFSET;
  Slice contents;
  string tmp;
  string manifest;
  Status SStack_d8;
  Slice local_d0;
  Slice local_c0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  DescriptorFileName(&local_50,dbname,descriptor_number);
  local_c0.data_ = local_50._M_dataplus._M_p;
  local_c0.size_ = local_50._M_string_length;
  std::operator+(&local_70,dbname,"/");
  local_90._M_dataplus._M_p = local_70._M_dataplus._M_p;
  local_90._M_string_length = local_70._M_string_length;
  bVar2 = Slice::starts_with(&local_c0,(Slice *)&local_90);
  if (!bVar2) {
    __assert_fail("contents.starts_with(dbname + \"/\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/filename.cc"
                  ,0x80,"Status leveldb::SetCurrentFile(Env *, const std::string &, uint64_t)");
  }
  std::__cxx11::string::~string((string *)&local_70);
  Slice::remove_prefix(&local_c0,dbname->_M_string_length + 1);
  TempFileName(&local_70,dbname,descriptor_number);
  Slice::ToString_abi_cxx11_(&local_b0,&local_c0);
  std::operator+(&local_90,&local_b0,"\n");
  local_d0.data_ = local_90._M_dataplus._M_p;
  local_d0.size_ = local_90._M_string_length;
  WriteStringToFileSync(this,env,&local_d0,&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  if (*(long *)this == 0) {
    CurrentFileName(&local_90,dbname);
    (*env->_vptr_Env[0xc])(&local_b0,env,&local_70,&local_90);
    pcVar1 = *(pointer *)this;
    *(pointer *)this = local_b0._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = pcVar1;
    Status::~Status((Status *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    if (*(long *)this == 0) goto LAB_00537bcb;
  }
  (*env->_vptr_Env[8])(&SStack_d8,env,&local_70);
  Status::~Status(&SStack_d8);
LAB_00537bcb:
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status SetCurrentFile(Env* env, const std::string& dbname,
                      uint64_t descriptor_number) {
  // Remove leading "dbname/" and add newline to manifest file name
  std::string manifest = DescriptorFileName(dbname, descriptor_number);
  Slice contents = manifest;
  assert(contents.starts_with(dbname + "/"));
  contents.remove_prefix(dbname.size() + 1);
  std::string tmp = TempFileName(dbname, descriptor_number);
  Status s = WriteStringToFileSync(env, contents.ToString() + "\n", tmp);
  if (s.ok()) {
    s = env->RenameFile(tmp, CurrentFileName(dbname));
  }
  if (!s.ok()) {
    env->DeleteFile(tmp);
  }
  return s;
}